

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

NodeAVL * avlRemove0(NodeAVL *nd,int freeMem)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  NodeAVL *extraout_RAX;
  NodeAVL *nd_00;
  NodeAVL *pNVar3;
  NodeAVL *l;
  
  pNVar2 = nd->left;
  if (nd->tmp == (NodeAVL *)0x0) {
    pNVar3 = nd->right;
    pNVar1 = nd->parent;
    nd_00 = (NodeAVL *)0x0;
    if (freeMem != 0) {
      free(nd);
      nd_00 = extraout_RAX;
    }
    if (pNVar3 == (NodeAVL *)0x0) {
      if (pNVar2 != (NodeAVL *)0x0) {
        pNVar2->parent = pNVar1;
      }
      return pNVar2;
    }
    nd = avlFindMin(nd_00);
    if (nd->right != (NodeAVL *)0x0) {
      nd->right->parent = nd->parent;
    }
    pNVar3 = avlRemoveMin(pNVar3);
    nd->right = pNVar3;
    nd->left = pNVar2;
    nd->parent = pNVar1;
    if (pNVar2 != (NodeAVL *)0x0) {
      pNVar2->parent = nd;
    }
    if (pNVar3 != (NodeAVL *)0x0) {
      pNVar3->parent = nd;
    }
  }
  else {
    if (nd->tmp == pNVar2) {
      pNVar2 = avlRemove0(pNVar2,freeMem);
      nd->left = pNVar2;
    }
    if (nd->tmp == nd->right) {
      pNVar2 = avlRemove0(nd->right,freeMem);
      nd->right = pNVar2;
    }
    nd->tmp = (NodeAVL *)0x0;
  }
  pNVar2 = avlBalance(nd);
  return pNVar2;
}

Assistant:

static
NodeAVL* avlRemove0( NodeAVL* nd, const int freeMem ){
    if ( nd->tmp ){
        if ( nd->tmp == nd->left ) nd->left = avlRemove0( nd->left, freeMem );
        if ( nd->tmp == nd->right ) nd->right = avlRemove0( nd->right, freeMem );
        nd->tmp = 0;
        return avlBalance( nd ); // FIXME ma tu byt ten return?
    } else return avlRemoveThisNode( nd, freeMem );
}